

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O3

bool __thiscall gui::DialogBox::handleKeyPressed(DialogBox *this,KeyEvent *key)

{
  Key KVar1;
  bool bVar2;
  Widget *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  float local_20;
  float fStack_1c;
  
  bVar2 = Widget::handleKeyPressed(&(this->super_Group).super_Container.super_Widget,key);
  KVar1 = key->code;
  if (KVar1 == Escape) {
    getOptionButton((DialogBox *)&stack0xffffffffffffffd0,(size_t)this);
    if (local_30 != (Widget *)0x0) {
      local_20 = 0.0;
      fStack_1c = 0.0;
      Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
                ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)
                 &local_30[1].onMouseLeave.callbacks_._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left,local_30,(Vector2<float> *)&stack0xffffffffffffffe0);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
  }
  else {
    if (KVar1 == Tab) {
      focusNextTextBox(this);
    }
    else {
      if (KVar1 != Enter) {
        return bVar2;
      }
      getOptionButton((DialogBox *)&stack0xffffffffffffffd0,(size_t)this);
      if (local_30 != (Widget *)0x0) {
        local_20 = 0.0;
        fStack_1c = 0.0;
        Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
                  ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)
                   &local_30[1].onMouseLeave.callbacks_._M_t._M_impl.super__Rb_tree_header._M_header
                    ._M_left,local_30,(Vector2<float> *)&stack0xffffffffffffffe0);
      }
      if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
      }
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool DialogBox::handleKeyPressed(const sf::Event::KeyEvent& key) {
    bool eventConsumed = baseClass::handleKeyPressed(key);
    if (key.code == sf::Keyboard::Enter) {
        const auto& submitButton = getSubmitButton();
        if (submitButton != nullptr) {
            submitButton->onClick.emit(submitButton.get(), sf::Vector2f(0.0f, 0.0f));
        }
    } else if (key.code == sf::Keyboard::Escape) {
        const auto& cancelButton = getCancelButton();
        if (cancelButton != nullptr) {
            cancelButton->onClick.emit(cancelButton.get(), sf::Vector2f(0.0f, 0.0f));
        }
        return eventConsumed;    // Do not consume escape event.
    } else if (key.code == sf::Keyboard::Tab) {
        focusNextTextBox();
    } else {
        return eventConsumed;
    }
    return true;
}